

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.cpp
# Opt level: O3

bool __thiscall
axl::xml::ExpatParserRoot::parseFile(ExpatParserRoot *this,StringRef *fileName,size_t blockSize)

{
  undefined8 uVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  ulong uVar8;
  SimpleMappedFile mappedFile;
  SimpleMappedFile local_88;
  
  local_88.m_file.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_88.m_mapping.m_mapping.m_p = (void *)0x0;
  local_88.m_mapping.m_mapping.m_size = 0;
  local_88.m_mapping.m_sharedMemory.super_File.
  super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (File)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_88.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_p = (C *)0x0;
  local_88.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_hdr._0_1_ = 0;
  local_88.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_hdr._1_7_ = 0;
  local_88.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_length._0_1_ = 0;
  local_88.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  ._17_8_ = 0;
  local_88.m_mapping.m_p = (void *)0x0;
  local_88.m_mapping.m_size = 0;
  local_88.m_openFlags = 0;
  if (blockSize + 1 < 2) {
    iVar4 = io::SimpleMappedFile::open(&local_88,(char *)fileName,0,0xffffffffffffffff,1);
    pvVar2 = local_88.m_mapping.m_p;
    if ((char)iVar4 != '\0') {
      uVar6 = io::psx::File::getSize((File *)&local_88);
      iVar4 = XML_Parse((this->
                        super_Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>
                        ).m_h,pvVar2,uVar6 & 0xffffffff,1);
      bVar3 = complete<bool>(this,iVar4 == 1,false);
      goto LAB_0012abd2;
    }
  }
  else {
    if ((g::getModule()::module == '\0') &&
       (iVar4 = __cxa_guard_acquire(&g::getModule()::module), iVar4 != 0)) {
      g::Module::Module((Module *)g::getModule()::module);
      __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
      __cxa_guard_release(&g::getModule()::module);
    }
    uVar1 = g::getModule()::module._16_8_;
    iVar4 = io::SimpleMappedFile::open(&local_88,(char *)fileName,0,0,1);
    if ((char)iVar4 != '\0') {
      uVar6 = io::psx::File::getSize((File *)&local_88);
      uVar8 = -uVar1 & (blockSize + uVar1) - 1;
      uVar7 = 0;
      do {
        iVar4 = (int)uVar7;
        if (uVar6 <= uVar8 + uVar7) {
          iVar5 = io::Mapping::open(&local_88.m_mapping,(char *)&local_88,iVar4,uVar6 - uVar7,
                                    (ulong)local_88.m_openFlags);
          if (CONCAT44(extraout_var_00,iVar5) != 0) {
            iVar4 = XML_Parse((this->
                              super_Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>
                              ).m_h,CONCAT44(extraout_var_00,iVar5),(int)uVar6 - iVar4,1);
            bVar3 = complete<bool>(this,iVar4 == 1,false);
            goto LAB_0012abd2;
          }
          break;
        }
        iVar4 = io::Mapping::open(&local_88.m_mapping,(char *)&local_88,iVar4,uVar8,
                                  (ulong)local_88.m_openFlags);
        if (CONCAT44(extraout_var,iVar4) == 0) break;
        iVar4 = XML_Parse((this->
                          super_Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>
                          ).m_h,CONCAT44(extraout_var,iVar4),uVar8 & 0xffffffff,0);
        bVar3 = complete<bool>(this,iVar4 == 1,false);
        uVar7 = uVar8 + uVar7;
      } while (bVar3);
    }
  }
  bVar3 = false;
LAB_0012abd2:
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
            (&local_88.m_mapping.m_sharedMemoryName.
              super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)
             &local_88.m_mapping.m_sharedMemory);
  io::psx::Mapping::~Mapping(&local_88.m_mapping.m_mapping);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_88);
  return bVar3;
}

Assistant:

bool
ExpatParserRoot::parseFile(
	const sl::StringRef& fileName,
	size_t blockSize
) {
	bool result;

	io::SimpleMappedFile mappedFile;

	if (!blockSize || blockSize == -1) {
		return
			mappedFile.open(fileName, io::FileFlag_ReadOnly) &&
			parse(mappedFile.p(), (size_t)mappedFile.getFileSize(), true);
	}

	// round-up block size

	size_t alignFactor = g::getModule()->getSystemInfo()->m_mappingAlignFactor;
	blockSize = (blockSize + alignFactor - 1) & ~(alignFactor - 1);

	result = mappedFile.open(fileName, 0, 0, io::FileFlag_ReadOnly);
	if (!result)
		return false;

	void* p;
	uint64_t offset = 0;
	uint64_t size = mappedFile.getFileSize();

	while (offset + blockSize < size) {
		result =
			(p = mappedFile.view(offset, blockSize)) &&
			parse(p, blockSize, false);

		if (!result)
			return false;

		offset += blockSize;
	}

	// final block

	blockSize = (size_t)(size - offset);

	return
		(p = mappedFile.view(offset, blockSize)) &&
		parse(p, blockSize, true);
}